

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp insert_free_var(sexp ctx,sexp x,sexp fv)

{
  sexp psVar1;
  sexp in_RDX;
  long in_RSI;
  bool bVar2;
  sexp ls;
  sexp loc;
  sexp name;
  sexp in_stack_ffffffffffffffb8;
  uint7 in_stack_ffffffffffffffc0;
  sexp n;
  
  psVar1 = *(sexp *)(*(long *)(in_RSI + 0x10) + 0x10);
  n = in_RDX;
  while( true ) {
    bVar2 = false;
    if (((ulong)n & 3) == 0) {
      bVar2 = n->tag == 6;
    }
    if (!bVar2) break;
    if ((*(sexp *)(in_RSI + 8) == (((n->value).type.name)->value).type.name) &&
       (psVar1 == (((((n->value).type.name)->value).type.cpl)->value).type.cpl)) {
      return in_RDX;
    }
    n = (n->value).type.cpl;
  }
  psVar1 = sexp_cons_op(*(sexp *)(in_RSI + 8),psVar1,(sexp_sint_t)n,
                        (sexp)(ulong)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  return psVar1;
}

Assistant:

static sexp insert_free_var (sexp ctx, sexp x, sexp fv) {
  sexp name=sexp_ref_name(x), loc=sexp_ref_loc(x), ls;
  for (ls=fv; sexp_pairp(ls); ls=sexp_cdr(ls))
    if ((name == sexp_ref_name(sexp_car(ls)))
        && (loc == sexp_ref_loc(sexp_car(ls))))
      return fv;
  return sexp_cons(ctx, x, fv);
}